

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O0

void rw::ps2::genericPreCB(MatPipeline *pipe,Geometry *geo)

{
  int local_24;
  int32 i;
  PipeAttribute *a;
  Geometry *geo_local;
  MatPipeline *pipe_local;
  
  local_24 = 0;
  do {
    if (9 < local_24) {
LAB_0013cfeb:
      skinPreCB(pipe,geo);
      return;
    }
    if ((pipe->attribs[local_24] != (PipeAttribute *)0x0) &&
       (pipe->attribs[local_24] == (PipeAttribute *)attribXYZW)) {
      allocateADC(geo);
      goto LAB_0013cfeb;
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

void
genericPreCB(MatPipeline *pipe, Geometry *geo)
{
	PipeAttribute *a;
	for(int32 i = 0; i < (int)nelem(pipe->attribs); i++)
		if((a = pipe->attribs[i]))
			if(a == &attribXYZW){
				allocateADC(geo);
				break;
			}
	skinPreCB(pipe, geo);
}